

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void __thiscall
ft::map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::map
          (map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *other)

{
  treeNode<ft::pair<const_int,_int>_> *ptVar1;
  treeNode<ft::pair<const_int,_int>_> *ptVar2;
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  local_48;
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  local_30;
  
  (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
  super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  ._vptr_treeBase = (_func_int **)&PTR__treeBase_00113c48;
  (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
  super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  .m_tree.NIL = (treeNode<ft::pair<const_int,_int>_> *)0x0;
  (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
  super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  .m_tree.m_root = (treeNode<ft::pair<const_int,_int>_> *)0x0;
  (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
  super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  .m_tree.m_first = (treeNode<ft::pair<const_int,_int>_> *)0x0;
  (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
  super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  .m_tree.m_last = (treeNode<ft::pair<const_int,_int>_> *)0x0;
  RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>::
  treeInit(&(this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            ).
            super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            .m_tree);
  (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
  super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  .m_size = 0;
  ptVar1 = (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>)
           .
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           .m_tree.m_first;
  (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
  super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  .m_tree.m_root =
       (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
       super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
       .m_tree.NIL;
  ptVar2 = (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>)
           .
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           .m_tree.m_last;
  ptVar1->parent = ptVar2;
  ptVar2->parent = ptVar1;
  (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
  super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  ._vptr_treeBase = (_func_int **)&PTR__map_00113be0;
  local_48.
  super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  .m_tree = &(other->
             super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
             super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
             .m_tree;
  local_48.
  super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  .m_node = ((other->
             super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
             super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
             .m_tree.m_first)->parent;
  local_48.
  super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  ._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113d00;
  local_30.
  super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  .m_node = (other->
            super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
            super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            .m_tree.m_last;
  local_30.
  super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  ._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113d00;
  local_30.
  super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  .m_tree = local_48.
            super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
            .m_tree;
  map<int,int,ft::less<int>,ft::allocator<ft::pair<int_const,int>>>::
  insert<ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>>
            ((map<int,int,ft::less<int>,ft::allocator<ft::pair<int_const,int>>> *)this,&local_48,
             &local_30,(type *)0x0);
  return;
}

Assistant:

map(map const & other):
		base(other) {
		this->insert(other.begin(), other.end());
	}